

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O3

Expr * __thiscall SQCompilation::SQParser::Factor(SQParser *this,SQInteger *pos)

{
  SQFloat SVar1;
  ulong uVar2;
  TableDecl *decl;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  Expr *v;
  long lVar8;
  Arena *pAVar9;
  ArrayExpr *this_00;
  ClassDecl *pCVar10;
  Chunk *pCVar11;
  int iVar12;
  byte bVar13;
  
  uVar6 = this->_depth;
  if (500 < uVar6) {
    reportDiagnostic(this,0x1d);
    uVar6 = this->_depth;
  }
  this->_depth = uVar6 + 1;
  lVar8 = this->_token;
  iVar12 = (int)(this->_lex)._tokenline;
  iVar7 = (int)(this->_lex)._tokencolumn;
  if (lVar8 < 0x116) {
    if (lVar8 < 0x7b) {
      if (lVar8 < 0x2d) {
        if (lVar8 != 0x21) {
          if (lVar8 == 0x28) {
            Lex(this);
            pAVar9 = (Arena *)Expression(this,this->_expression_context);
            pCVar11 = Arena::findChunk(this->_astArena,0x28);
            this_00 = (ArrayExpr *)pCVar11->_ptr;
            pCVar11->_ptr = (uint8_t *)&(this_00->_inits)._vals;
            (this_00->super_Expr).super_Node._op = TO_PAREN;
            (this_00->super_Expr).super_Node._coordinates.lineStart = -1;
            (this_00->super_Expr).super_Node._coordinates.columnStart = -1;
            (this_00->super_Expr).super_Node._coordinates.lineEnd = -1;
            (this_00->super_Expr).super_Node._coordinates.columnEnd = -1;
            (this_00->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
                 (_func_int **)&PTR__ArenaObj_001a2bd8;
            (this_00->_inits)._arena = pAVar9;
            (this_00->super_Expr).super_Node._coordinates.lineStart = iVar12;
            (this_00->super_Expr).super_Node._coordinates.columnStart = iVar7;
            (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
            (this_00->super_Expr).super_Node._coordinates.columnEnd =
                 (int)(this->_lex)._currentcolumn;
            Expect(this,0x29);
            goto LAB_001632f7;
          }
          goto switchD_00162829_caseD_11e;
        }
        Lex(this);
        this_00 = (ArrayExpr *)UnaryOP(this,TO_NOT);
      }
      else {
        if (lVar8 != 0x2d) {
          if (lVar8 == 0x40) {
            bVar5 = true;
            goto LAB_00162de0;
          }
          if (lVar8 == 0x5b) {
            Lex(this);
            pAVar9 = this->_astArena;
            pCVar11 = Arena::findChunk(pAVar9,0x38);
            this_00 = (ArrayExpr *)pCVar11->_ptr;
            pCVar11->_ptr = (uint8_t *)(this_00 + 1);
            (this_00->super_Expr).super_Node._op = TO_ARRAYEXPR;
            (this_00->super_Expr).super_Node._coordinates.lineStart = -1;
            (this_00->super_Expr).super_Node._coordinates.columnStart = -1;
            (this_00->super_Expr).super_Node._coordinates.lineEnd = -1;
            (this_00->super_Expr).super_Node._coordinates.columnEnd = -1;
            (this_00->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
                 (_func_int **)&PTR__ArenaObj_001a2d98;
            (this_00->_inits)._arena = pAVar9;
            (this_00->_inits)._vals = (Expr **)0x0;
            (this_00->_inits)._size = 0;
            (this_00->_inits)._allocated = 0;
            if (this->_token != 0x5d) {
              bVar13 = 0;
              bVar3 = 0;
              bVar5 = false;
              do {
                v = Expression(this,SQE_ARRAY_ELEM);
                ArrayExpr::addValue(this_00,v);
                lVar8 = this->_token;
                if (lVar8 == 0x2c) {
LAB_00162902:
                  bVar5 = true;
                  if (!(bool)(~bVar3 & 1 | bVar13)) {
                    reportDiagnostic(this,0x6d,"elements of array");
                    lVar8 = this->_token;
                    bVar5 = true;
                    bVar13 = 1;
                  }
                }
                else {
                  bVar4 = 1;
                  if (lVar8 == 0x5d) {
                    bVar4 = bVar3;
                  }
                  bVar3 = bVar4;
                  if (bVar5) goto LAB_00162902;
                  bVar5 = false;
                }
                if (lVar8 == 0x2c) {
                  Lex(this);
                  lVar8 = this->_token;
                }
              } while (lVar8 != 0x5d);
            }
            (this_00->super_Expr).super_Node._coordinates.lineStart = iVar12;
            (this_00->super_Expr).super_Node._coordinates.columnStart = iVar7;
            (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
            (this_00->super_Expr).super_Node._coordinates.columnEnd =
                 (int)(this->_lex)._currentcolumn;
            Lex(this);
            goto LAB_001632f7;
          }
          goto switchD_00162829_caseD_11e;
        }
        Lex(this);
        if (this->_token == 0x105) {
          SVar1 = (this->_lex)._fvalue;
          pCVar11 = Arena::findChunk(this->_astArena,0x28);
          uVar6 = (uint)DAT_001766b0;
          this_00 = (ArrayExpr *)pCVar11->_ptr;
          pCVar11->_ptr = (uint8_t *)&(this_00->_inits)._vals;
          *(undefined8 *)&(this_00->super_Expr).super_Node._op = 0x200000039;
          (this_00->super_Expr).super_Node._coordinates.lineEnd = -1;
          (this_00->super_Expr).super_Node._coordinates.columnEnd = -1;
          (this_00->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
               (_func_int **)&PTR__ArenaObj_001a2d28;
          *(uint *)&(this_00->_inits)._arena = (uint)SVar1 ^ uVar6;
          (this_00->super_Expr).super_Node._coordinates.lineStart = iVar12;
          (this_00->super_Expr).super_Node._coordinates.columnStart = iVar7;
          (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
          (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn
          ;
          Lex(this);
          goto LAB_001632f7;
        }
        if (this->_token == 0x104) {
          lVar8 = (this->_lex)._nvalue;
          pCVar11 = Arena::findChunk(this->_astArena,0x28);
          this_00 = (ArrayExpr *)pCVar11->_ptr;
          pCVar11->_ptr = (uint8_t *)&(this_00->_inits)._vals;
          *(undefined8 *)&(this_00->super_Expr).super_Node._op = 0x100000039;
          (this_00->super_Expr).super_Node._coordinates.lineEnd = -1;
          (this_00->super_Expr).super_Node._coordinates.columnEnd = -1;
          (this_00->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
               (_func_int **)&PTR__ArenaObj_001a2d28;
          (this_00->_inits)._arena = (Arena *)-lVar8;
          (this_00->super_Expr).super_Node._coordinates.lineStart = iVar12;
          (this_00->super_Expr).super_Node._coordinates.columnStart = iVar7;
          (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
          (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn
          ;
          Lex(this);
          goto LAB_001632f7;
        }
        this_00 = (ArrayExpr *)UnaryOP(this,TO_NEG);
      }
      goto LAB_001632d3;
    }
    switch(lVar8) {
    case 0x102:
      this_00 = (ArrayExpr *)newId(this,(this->_lex)._svalue);
      (this_00->super_Expr).super_Node._coordinates.lineStart = iVar12;
      (this_00->super_Expr).super_Node._coordinates.columnStart = iVar7;
      Lex(this);
      break;
    case 0x103:
      this_00 = (ArrayExpr *)newStringLiteral(this,(this->_lex)._svalue);
      (this_00->super_Expr).super_Node._coordinates.lineStart = iVar12;
      (this_00->super_Expr).super_Node._coordinates.columnStart = iVar7;
      Lex(this);
      break;
    case 0x104:
      pAVar9 = (Arena *)(this->_lex)._nvalue;
      pCVar11 = Arena::findChunk(this->_astArena,0x28);
      this_00 = (ArrayExpr *)pCVar11->_ptr;
      pCVar11->_ptr = (uint8_t *)&(this_00->_inits)._vals;
      *(undefined8 *)&(this_00->super_Expr).super_Node._op = 0x100000039;
      (this_00->super_Expr).super_Node._coordinates.lineEnd = -1;
      (this_00->super_Expr).super_Node._coordinates.columnEnd = -1;
      (this_00->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
           (_func_int **)&PTR__ArenaObj_001a2d28;
      (this_00->_inits)._arena = pAVar9;
      (this_00->super_Expr).super_Node._coordinates.lineStart = iVar12;
      (this_00->super_Expr).super_Node._coordinates.columnStart = iVar7;
      (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
      (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
      Lex(this);
      break;
    case 0x105:
      SVar1 = (this->_lex)._fvalue;
      pCVar11 = Arena::findChunk(this->_astArena,0x28);
      this_00 = (ArrayExpr *)pCVar11->_ptr;
      pCVar11->_ptr = (uint8_t *)&(this_00->_inits)._vals;
      *(undefined8 *)&(this_00->super_Expr).super_Node._op = 0x200000039;
      (this_00->super_Expr).super_Node._coordinates.lineEnd = -1;
      (this_00->super_Expr).super_Node._coordinates.columnEnd = -1;
      (this_00->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
           (_func_int **)&PTR__ArenaObj_001a2d28;
      *(SQFloat *)&(this_00->_inits)._arena = SVar1;
      (this_00->super_Expr).super_Node._coordinates.lineStart = iVar12;
      (this_00->super_Expr).super_Node._coordinates.columnStart = iVar7;
      (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
      (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
      Lex(this);
      break;
    case 0x106:
      pCVar11 = Arena::findChunk(this->_astArena,0x20);
      this_00 = (ArrayExpr *)pCVar11->_ptr;
      pCVar11->_ptr = (uint8_t *)&this_00->_inits;
      (this_00->super_Expr).super_Node._op = TO_BASE;
      (this_00->super_Expr).super_Node._coordinates.lineEnd = -1;
      (this_00->super_Expr).super_Node._coordinates.columnEnd = -1;
      (this_00->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
           (_func_int **)&PTR__ArenaObj_001a2c80;
      (this_00->super_Expr).super_Node._coordinates.lineStart = iVar12;
      (this_00->super_Expr).super_Node._coordinates.columnStart = iVar7;
      (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
      (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
      Lex(this);
      break;
    case 0x107:
      if ((this->_lang_features & 4) != 0) {
        reportDiagnostic(this,0x21);
      }
      this_00 = (ArrayExpr *)DeleteExpr(this);
      break;
    default:
      if (lVar8 != 0x7b) {
        if (lVar8 != 0x7e) goto switchD_00162829_caseD_11e;
        Lex(this);
        if (this->_token == 0x104) {
          uVar2 = (this->_lex)._nvalue;
          pCVar11 = Arena::findChunk(this->_astArena,0x28);
          this_00 = (ArrayExpr *)pCVar11->_ptr;
          pCVar11->_ptr = (uint8_t *)&(this_00->_inits)._vals;
          *(undefined8 *)&(this_00->super_Expr).super_Node._op = 0x100000039;
          (this_00->super_Expr).super_Node._coordinates.lineEnd = -1;
          (this_00->super_Expr).super_Node._coordinates.columnEnd = -1;
          (this_00->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
               (_func_int **)&PTR__ArenaObj_001a2d28;
          (this_00->_inits)._arena = (Arena *)~uVar2;
          (this_00->super_Expr).super_Node._coordinates.lineStart = iVar12;
          (this_00->super_Expr).super_Node._coordinates.columnStart = iVar7;
          (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
          (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn
          ;
          Lex(this);
          break;
        }
        this_00 = (ArrayExpr *)UnaryOP(this,TO_BNOT);
        goto LAB_001632d3;
      }
      Lex(this);
      pAVar9 = this->_astArena;
      pCVar11 = Arena::findChunk(pAVar9,0x38);
      decl = (TableDecl *)pCVar11->_ptr;
      pCVar11->_ptr = (uint8_t *)(decl + 1);
      (decl->super_Decl).super_Statement.super_Node._op = TO_TABLE;
      (decl->super_Decl).super_Statement.super_Node._coordinates.lineStart = -1;
      (decl->super_Decl).super_Statement.super_Node._coordinates.columnStart = -1;
      (decl->super_Decl).super_Statement.super_Node._coordinates.lineEnd = -1;
      (decl->super_Decl).super_Statement.super_Node._coordinates.columnEnd = -1;
      (decl->super_Decl).super_Statement.super_Node.super_ArenaObj._vptr_ArenaObj =
           (_func_int **)&PTR__ArenaObj_001a2fd0;
      (decl->_members)._arena = pAVar9;
      (decl->_members)._vals = (TableMember *)0x0;
      (decl->_members)._size = 0;
      (decl->_members)._allocated = 0;
      ParseTableOrClass(this,decl,0x2c,0x7d);
      (decl->super_Decl).super_Statement.super_Node._coordinates.lineStart = iVar12;
      (decl->super_Decl).super_Statement.super_Node._coordinates.columnStart = iVar7;
      (decl->super_Decl).super_Statement.super_Node._coordinates.lineEnd =
           (int)(this->_lex)._currentline;
      (decl->super_Decl).super_Statement.super_Node._coordinates.columnEnd =
           (int)(this->_lex)._currentcolumn;
      pCVar11 = Arena::findChunk(this->_astArena,0x28);
      this_00 = (ArrayExpr *)pCVar11->_ptr;
      pCVar11->_ptr = (uint8_t *)&(this_00->_inits)._vals;
      (this_00->super_Expr).super_Node._op = TO_DECL_EXPR;
      (this_00->super_Expr).super_Node._coordinates.lineEnd = -1;
      (this_00->super_Expr).super_Node._coordinates.columnEnd = -1;
      (this_00->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
           (_func_int **)&PTR__ArenaObj_001a2d60;
      (this_00->_inits)._arena = (Arena *)decl;
      (this_00->super_Expr).super_Node._coordinates.lineStart = iVar12;
      (this_00->super_Expr).super_Node._coordinates.columnStart = iVar7;
      (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
      goto LAB_001632f1;
    }
    goto LAB_001632f7;
  }
  switch(lVar8) {
  case 0x11c:
    Lex(this);
    this_00 = (ArrayExpr *)UnaryOP(this,TO_CLONE);
    goto LAB_001632d3;
  case 0x11d:
    bVar5 = false;
LAB_00162de0:
    this_00 = (ArrayExpr *)FunctionExp(this,bVar5);
    break;
  case 0x11e:
  case 0x120:
  case 0x121:
  case 0x122:
  case 0x123:
  case 0x124:
  case 0x125:
  case 0x126:
  case 0x127:
  case 0x128:
  case 0x129:
  case 300:
  case 0x12d:
  case 0x131:
  case 0x132:
  case 0x134:
  case 0x135:
  case 0x137:
  case 0x138:
    goto switchD_00162829_caseD_11e;
  case 0x11f:
    Lex(this);
    this_00 = (ArrayExpr *)UnaryOP(this,TO_TYPEOF);
    goto LAB_001632d3;
  case 0x12a:
    Lex(this);
    this_00 = (ArrayExpr *)UnaryOP(this,TO_RESUME);
    goto LAB_001632d3;
  case 299:
    if ((this->_lang_features & 1) != 0) {
      reportDiagnostic(this,0x20);
    }
    this->_token = 0x2e;
    pCVar11 = Arena::findChunk(this->_astArena,0x20);
    this_00 = (ArrayExpr *)pCVar11->_ptr;
    pCVar11->_ptr = (uint8_t *)&this_00->_inits;
    (this_00->super_Expr).super_Node._op = TO_ROOT_TABLE_ACCESS;
    (this_00->super_Expr).super_Node._coordinates.lineEnd = -1;
    (this_00->super_Expr).super_Node._coordinates.columnEnd = -1;
    (this_00->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
         (_func_int **)&PTR__ArenaObj_001a2cb8;
    goto LAB_001632d3;
  case 0x12e:
    pCVar11 = Arena::findChunk(this->_astArena,0x28);
    this_00 = (ArrayExpr *)pCVar11->_ptr;
    pCVar11->_ptr = (uint8_t *)&(this_00->_inits)._vals;
    (this_00->super_Expr).super_Node._op = TO_ID;
    (this_00->super_Expr).super_Node._coordinates.lineEnd = -1;
    (this_00->super_Expr).super_Node._coordinates.columnEnd = -1;
    (this_00->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
         (_func_int **)&PTR__ArenaObj_001a2b50;
    (this_00->_inits)._arena = (Arena *)"this";
    (this_00->super_Expr).super_Node._coordinates.lineStart = iVar12;
    (this_00->super_Expr).super_Node._coordinates.columnStart = iVar7;
    (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
    (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    Lex(this);
    break;
  case 0x12f:
  case 0x130:
    this_00 = (ArrayExpr *)PrefixIncDec(this,lVar8);
    goto LAB_001632d3;
  case 0x133:
    Lex(this);
    pCVar10 = ClassExp(this,(Expr *)0x0);
    pCVar11 = Arena::findChunk(this->_astArena,0x28);
    this_00 = (ArrayExpr *)pCVar11->_ptr;
    pCVar11->_ptr = (uint8_t *)&(this_00->_inits)._vals;
    (this_00->super_Expr).super_Node._op = TO_DECL_EXPR;
    (this_00->super_Expr).super_Node._coordinates.lineEnd = -1;
    (this_00->super_Expr).super_Node._coordinates.columnEnd = -1;
    (this_00->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
         (_func_int **)&PTR__ArenaObj_001a2d60;
    (this_00->_inits)._arena = (Arena *)pCVar10;
LAB_001632d3:
    (this_00->super_Expr).super_Node._coordinates.lineStart = iVar12;
    (this_00->super_Expr).super_Node._coordinates.columnStart = iVar7;
    (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
LAB_001632f1:
    (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    break;
  case 0x136:
    pCVar11 = Arena::findChunk(this->_astArena,0x28);
    this_00 = (ArrayExpr *)pCVar11->_ptr;
    pCVar11->_ptr = (uint8_t *)&(this_00->_inits)._vals;
    (this_00->super_Expr).super_Node._op = TO_ID;
    (this_00->super_Expr).super_Node._coordinates.lineEnd = -1;
    (this_00->super_Expr).super_Node._coordinates.columnEnd = -1;
    (this_00->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
         (_func_int **)&PTR__ArenaObj_001a2b50;
    (this_00->_inits)._arena = (Arena *)"constructor";
    (this_00->super_Expr).super_Node._coordinates.lineStart = iVar12;
    (this_00->super_Expr).super_Node._coordinates.columnStart = iVar7;
    (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
    (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    Lex(this);
    break;
  case 0x139:
    pAVar9 = (Arena *)(this->_lex)._currentline;
    pCVar11 = Arena::findChunk(this->_astArena,0x28);
    this_00 = (ArrayExpr *)pCVar11->_ptr;
    pCVar11->_ptr = (uint8_t *)&(this_00->_inits)._vals;
    *(undefined8 *)&(this_00->super_Expr).super_Node._op = 0x100000039;
    (this_00->super_Expr).super_Node._coordinates.lineEnd = -1;
    (this_00->super_Expr).super_Node._coordinates.columnEnd = -1;
    (this_00->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
         (_func_int **)&PTR__ArenaObj_001a2d28;
    (this_00->_inits)._arena = pAVar9;
    (this_00->super_Expr).super_Node._coordinates.lineStart = iVar12;
    (this_00->super_Expr).super_Node._coordinates.columnStart = iVar7;
    (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
    (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    Lex(this);
    break;
  case 0x13a:
    pAVar9 = (Arena *)this->_sourcename;
    pCVar11 = Arena::findChunk(this->_astArena,0x28);
    this_00 = (ArrayExpr *)pCVar11->_ptr;
    pCVar11->_ptr = (uint8_t *)&(this_00->_inits)._vals;
    *(undefined8 *)&(this_00->super_Expr).super_Node._op = 0x39;
    (this_00->super_Expr).super_Node._coordinates.lineEnd = -1;
    (this_00->super_Expr).super_Node._coordinates.columnEnd = -1;
    (this_00->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
         (_func_int **)&PTR__ArenaObj_001a2d28;
    (this_00->_inits)._arena = pAVar9;
    (this_00->super_Expr).super_Node._coordinates.lineStart = iVar12;
    (this_00->super_Expr).super_Node._coordinates.columnStart = iVar7;
    (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
    (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    Lex(this);
    break;
  case 0x13b:
  case 0x13c:
    pCVar11 = Arena::findChunk(this->_astArena,0x28);
    this_00 = (ArrayExpr *)pCVar11->_ptr;
    pCVar11->_ptr = (uint8_t *)&(this_00->_inits)._vals;
    *(undefined8 *)&(this_00->super_Expr).super_Node._op = 0x300000039;
    (this_00->super_Expr).super_Node._coordinates.lineEnd = -1;
    (this_00->super_Expr).super_Node._coordinates.columnEnd = -1;
    (this_00->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
         (_func_int **)&PTR__ArenaObj_001a2d28;
    (this_00->_inits)._arena = (Arena *)(ulong)(lVar8 == 0x13b);
    (this_00->super_Expr).super_Node._coordinates.lineStart = iVar12;
    (this_00->super_Expr).super_Node._coordinates.columnStart = iVar7;
    (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
    (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    Lex(this);
    break;
  default:
    if (lVar8 == 0x116) {
      pCVar11 = Arena::findChunk(this->_astArena,0x28);
      this_00 = (ArrayExpr *)pCVar11->_ptr;
      pCVar11->_ptr = (uint8_t *)&(this_00->_inits)._vals;
      *(undefined8 *)&(this_00->super_Expr).super_Node._op = 0x400000039;
      (this_00->super_Expr).super_Node._coordinates.lineEnd = -1;
      (this_00->super_Expr).super_Node._coordinates.columnEnd = -1;
      (this_00->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
           (_func_int **)&PTR__ArenaObj_001a2d28;
      (this_00->_inits)._arena = (Arena *)0x0;
      (this_00->super_Expr).super_Node._coordinates.lineStart = iVar12;
      (this_00->super_Expr).super_Node._coordinates.columnStart = iVar7;
      (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
      (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
      Lex(this);
      break;
    }
    if (lVar8 == 0x154) {
      this_00 = (ArrayExpr *)parseStringTemplate(this);
      break;
    }
    goto switchD_00162829_caseD_11e;
  }
LAB_001632f7:
  this->_depth = this->_depth - 1;
  return &this_00->super_Expr;
switchD_00162829_caseD_11e:
  this_00 = (ArrayExpr *)0x0;
  reportDiagnostic(this,0x19,"expression");
  goto LAB_001632f7;
}

Assistant:

Expr* SQParser::Factor(SQInteger &pos)
{
    NestingChecker nc(this);
    Expr *r = NULL;

    SQInteger l = line(), c = column();

    switch(_token)
    {
    case TK_STRING_LITERAL:
        r = newStringLiteral(_lex._svalue);
        r->setLineStartPos(l); r->setColumnStartPos(c);
        Lex();
        break;
    case TK_TEMPLATE_OP:
        r = parseStringTemplate();
        break;
    case TK_BASE:
        r = setCoordinates(newNode<BaseExpr>(), l, c);
        Lex();
        break;
    case TK_IDENTIFIER:
        r = newId(_lex._svalue);
        r->setLineStartPos(l); r->setColumnStartPos(c);
        Lex();
        break;
    case TK_CONSTRUCTOR:
        r = setCoordinates(newNode<Id>(_SC("constructor")), l, c);
        Lex();
        break;
    case TK_THIS: r = setCoordinates(newNode<Id>(_SC("this")), l, c); Lex(); break;
    case TK_DOUBLE_COLON:  // "::"
        if (_lang_features & LF_FORBID_ROOT_TABLE)
            reportDiagnostic(DiagnosticsId::DI_ROOT_TABLE_FORBIDDEN);
        _token = _SC('.'); /* hack: drop into PrefixExpr, case '.'*/
        r = setCoordinates(newNode<RootTableAccessExpr>(), l, c);
        break;
    case TK_NULL:
        r = setCoordinates(newNode<LiteralExpr>(), l, c);
        Lex();
        break;
    case TK_INTEGER:
        r = setCoordinates(newNode<LiteralExpr>(_lex._nvalue), l, c);
        Lex();
        break;
    case TK_FLOAT:
        r = setCoordinates(newNode<LiteralExpr>(_lex._fvalue), l, c);
        Lex();
        break;
    case TK_TRUE: case TK_FALSE:
        r = setCoordinates(newNode<LiteralExpr>((bool)(_token == TK_TRUE)), l, c);
        Lex();
        break;
    case _SC('['): {
            Lex();
            ArrayExpr *arr = newNode<ArrayExpr>(arena());
            bool commaSeparated = false;
            bool spaceSeparated = false;
            bool reported = false;
            while(_token != _SC(']')) {
                Expr *v = Expression(SQE_ARRAY_ELEM);
                arr->addValue(v);
                if (_token == _SC(',')) {
                    commaSeparated = true;
                }
                else if (_token != _SC(']')) {
                    spaceSeparated = true;
                }

                if (commaSeparated && spaceSeparated && !reported) {
                    reported = true; // do not spam in output, a single diag seems to be enough
                    reportDiagnostic(DiagnosticsId::DI_MIXED_SEPARATORS, "elements of array");
                }

                if (_token == _SC(',')) {
                    Lex();
                }
            }
            setCoordinates(arr, l, c);
            Lex();
            r = arr;
        }
        break;
    case _SC('{'): {
        Lex();
        TableDecl *t = newNode<TableDecl>(arena());
        ParseTableOrClass(t, _SC(','), _SC('}'));
        setCoordinates(t, l, c);
        r = setCoordinates(newNode<DeclExpr>(t), l, c);
        break;
    }
    case TK_FUNCTION:
        r = FunctionExp(false);
        break;
    case _SC('@'):
        r = FunctionExp(true);
        break;
    case TK_CLASS: {
        Lex();
        Decl *classDecl = ClassExp(NULL);
        r = setCoordinates(newNode<DeclExpr>(classDecl), l, c);
        break;
    }
    case _SC('-'):
        Lex();
        switch(_token) {
        case TK_INTEGER:
            r = setCoordinates(newNode<LiteralExpr>(-_lex._nvalue), l, c);
            Lex();
            break;
        case TK_FLOAT:
            r = setCoordinates(newNode<LiteralExpr>(-_lex._fvalue), l, c);
            Lex();
            break;
        default:
            r = setCoordinates(UnaryOP(TO_NEG), l, c);
            break;
        }
        break;
    case _SC('!'):
        Lex();
        r = setCoordinates(UnaryOP(TO_NOT), l, c);
        break;
    case _SC('~'):
        Lex();
        if(_token == TK_INTEGER)  {
            r = setCoordinates(newNode<LiteralExpr>(~_lex._nvalue), l, c);
            Lex();
        }
        else {
            r = setCoordinates(UnaryOP(TO_BNOT), l, c);
        }
        break;
    case TK_TYPEOF : Lex(); r = setCoordinates(UnaryOP(TO_TYPEOF), l, c); break;
    case TK_RESUME : Lex(); r = setCoordinates(UnaryOP(TO_RESUME), l, c); break;
    case TK_CLONE : Lex(); r = setCoordinates(UnaryOP(TO_CLONE), l, c); break;
    case TK_MINUSMINUS :
    case TK_PLUSPLUS :
        r = setCoordinates(PrefixIncDec(_token), l, c);
        break;
    case TK_DELETE :
        if (_lang_features & LF_FORBID_DELETE_OP) {
            reportDiagnostic(DiagnosticsId::DI_DELETE_OP_FORBIDDEN);
        }
        r = DeleteExpr();
        break;
    case _SC('('):
        Lex();
        r = setCoordinates(newNode<UnExpr>(TO_PAREN, Expression(_expression_context)), l, c);
        Expect(_SC(')'));
        break;
    case TK___LINE__:
        r = setCoordinates(newNode<LiteralExpr>(_lex._currentline), l, c);
        Lex();
        break;
    case TK___FILE__:
        r = setCoordinates(newNode<LiteralExpr>(_sourcename), l, c);
        Lex();
        break;
    default:
        reportDiagnostic(DiagnosticsId::DI_EXPECTED_TOKEN, "expression");
    }
    return r;
}